

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall ftxui::ContainerBase::MoveSelectorWrap(ContainerBase *this,int dir)

{
  pointer psVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = 0;
  lVar3 = (long)dir;
  do {
    psVar1 = (this->super_ComponentBase).children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->super_ComponentBase).children_.
                  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4;
    uVar5 = uVar5 + 1;
    if (uVar4 <= uVar5) {
      return;
    }
    iVar6 = (int)((lVar3 + uVar4 + (long)*this->selector_) % uVar4);
    cVar2 = (**(code **)((long)(psVar1[iVar6].
                                super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ComponentBase + 0x28))();
    lVar3 = lVar3 + dir;
  } while (cVar2 == '\0');
  *this->selector_ = iVar6;
  return;
}

Assistant:

void MoveSelectorWrap(int dir) {
    for (size_t offset = 1; offset < children_.size(); ++offset) {
      int i = (*selector_ + offset * dir + children_.size()) % children_.size();
      if (children_[i]->Focusable()) {
        *selector_ = i;
        return;
      }
    }
  }